

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

CURLcode Curl_sha256it(uchar *output,uchar *input,size_t length)

{
  CURLcode CVar1;
  uint uVar2;
  EVP_MD_CTX *in_RAX;
  my_sha256_ctx ctx;
  my_sha256_ctx local_28;
  
  local_28.openssl_ctx = (EVP_MD_CTX *)in_RAX;
  CVar1 = my_sha256_init(&local_28);
  if (CVar1 == CURLE_OK) {
    uVar2 = curlx_uztoui(length);
    EVP_DigestUpdate((EVP_MD_CTX *)local_28.openssl_ctx,input,(ulong)uVar2);
    EVP_DigestFinal_ex((EVP_MD_CTX *)local_28.openssl_ctx,output,(uint *)0x0);
    EVP_MD_CTX_free(local_28.openssl_ctx);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_sha256it(unsigned char *output, const unsigned char *input,
                   const size_t length)
{
  CURLcode result;
  my_sha256_ctx ctx;

  result = my_sha256_init(&ctx);
  if(!result) {
    my_sha256_update(&ctx, input, curlx_uztoui(length));
    my_sha256_final(output, &ctx);
  }
  return result;
}